

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRefSelect.c
# Opt level: O1

Vec_Int_t * Rnm_ManFilterSelected(Rnm_Man_t *p,Vec_Int_t *vOldPPis)

{
  char cVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  long lVar8;
  Vec_Int_t *p_00;
  int *piVar9;
  size_t sVar10;
  Vec_Int_t *pVVar11;
  int iVar12;
  long lVar13;
  size_t __nmemb;
  long lVar14;
  
  p->vFanins->nSize = 0;
  if (0 < vOldPPis->nSize) {
    lVar14 = 0;
    do {
      iVar12 = vOldPPis->pArray[lVar14];
      if (((long)iVar12 < 0) || (pGVar3 = p->pGia, pGVar3->nObjs <= iVar12)) goto LAB_00574bee;
      if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
      Ga2_ObjLeaves(pGVar3,pGVar3->pObjs + iVar12);
      if (0 < Ga2_ObjLeaves_v_0) {
        lVar13 = 0;
        do {
          iVar12 = *(int *)(Ga2_ObjLeaves_v_1 + lVar13 * 4);
          lVar8 = (long)iVar12;
          if ((lVar8 < 0) || (p->pGia->nObjs <= iVar12)) goto LAB_00574bee;
          pGVar4 = p->pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          if (p->vCounts->nSize <= iVar12) goto LAB_00574c0d;
          pcVar5 = p->vCounts->pArray;
          cVar1 = pcVar5[lVar8];
          if (cVar1 < '\x10') {
            pcVar5[lVar8] = cVar1 + '\x01';
          }
          if (cVar1 == '\0') {
            pGVar4 = pGVar4 + lVar8;
            pGVar6 = p->pGia->pObjs;
            if ((pGVar4 < pGVar6) || (pGVar6 + p->pGia->nObjs <= pGVar4)) goto LAB_00574c2c;
            Vec_IntPush(p->vFanins,(int)((ulong)((long)pGVar4 - (long)pGVar6) >> 2) * -0x55555555);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < Ga2_ObjLeaves_v_0);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < vOldPPis->nSize);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(400);
  p_00->pArray = piVar9;
  if (0 < vOldPPis->nSize) {
    lVar14 = 0;
    do {
      iVar12 = vOldPPis->pArray[lVar14];
      if ((long)iVar12 < 0) goto LAB_00574bee;
      pGVar3 = p->pGia;
      if (pGVar3->nObjs <= iVar12) goto LAB_00574bee;
      if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = pGVar3->pObjs + iVar12;
      if (((~(uint)*(undefined8 *)pGVar4 & 0x9fffffff) == 0) &&
         (pGVar3->vCis->nSize - pGVar3->nRegs <=
          (int)((uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) & 0x1fffffff))) {
        if (pGVar3->nObjs <= iVar12) {
LAB_00574c2c:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
LAB_00574b1f:
        Vec_IntPush(p_00,iVar12);
      }
      else {
        Ga2_ObjLeaves(pGVar3,pGVar4);
        if (0 < (long)Ga2_ObjLeaves_v_0) {
          lVar13 = 0;
          do {
            iVar12 = *(int *)(Ga2_ObjLeaves_v_1 + lVar13 * 4);
            lVar8 = (long)iVar12;
            if (lVar8 < 0) goto LAB_00574bee;
            iVar7 = p->pGia->nObjs;
            if (iVar7 <= iVar12) goto LAB_00574bee;
            pGVar6 = p->pGia->pObjs;
            if (pGVar6 == (Gia_Obj_t *)0x0) break;
            if ((~*(ulong *)(pGVar6 + lVar8) & 0x1fffffff1fffffff) == 0) {
LAB_00574aed:
              if ((pGVar4 < pGVar6) || (pGVar6 + iVar7 <= pGVar4)) goto LAB_00574c2c;
              iVar12 = (int)((ulong)((long)pGVar4 - (long)pGVar6) >> 2) * -0x55555555;
              goto LAB_00574b1f;
            }
            uVar2 = pGVar6[lVar8].Value;
            if ((ulong)uVar2 != 0) {
              if (p->nObjsFrame <= (int)uVar2) {
                __assert_fail("(int)pObj->Value < p->nObjsFrame",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                              ,0x60,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
              }
              if (p->pCex->iFrame < 0) {
                __assert_fail("f >= 0 && f <= p->pCex->iFrame",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                              ,0x61,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
              }
              if (((uint)p->pObjs[uVar2] & 4) != 0) goto LAB_00574aed;
            }
            if (iVar7 <= iVar12) goto LAB_00574c2c;
            if (p->vCounts->nSize <= iVar12) {
LAB_00574c0d:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            if ('\x01' < p->vCounts->pArray[lVar8]) goto LAB_00574aed;
            lVar13 = lVar13 + 1;
          } while (Ga2_ObjLeaves_v_0 != lVar13);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < vOldPPis->nSize);
  }
  iVar12 = p_00->nSize;
  __nmemb = (size_t)iVar12;
  if (1 < (long)__nmemb) {
    piVar9 = p_00->pArray;
    qsort(piVar9,__nmemb,4,Vec_IntSortCompare1);
    iVar7 = 1;
    sVar10 = 1;
    do {
      if (piVar9[sVar10] != piVar9[sVar10 - 1]) {
        lVar14 = (long)iVar7;
        iVar7 = iVar7 + 1;
        piVar9[lVar14] = piVar9[sVar10];
      }
      sVar10 = sVar10 + 1;
    } while (__nmemb != sVar10);
    p_00->nSize = iVar7;
    if (iVar12 != iVar7) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRefSelect.c"
                    ,0xb2,"Vec_Int_t *Rnm_ManFilterSelected(Rnm_Man_t *, Vec_Int_t *)");
    }
  }
  pVVar11 = p->vFanins;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      iVar12 = pVVar11->pArray[lVar14];
      if (((long)iVar12 < 0) || (p->pGia->nObjs <= iVar12)) {
LAB_00574bee:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pGia->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      if (p->vCounts->nSize <= iVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      p->vCounts->pArray[iVar12] = '\0';
      lVar14 = lVar14 + 1;
      pVVar11 = p->vFanins;
    } while (lVar14 < pVVar11->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Rnm_ManFilterSelected( Rnm_Man_t * p, Vec_Int_t * vOldPPis )
{
    int fVerbose = 0;
    Vec_Int_t * vNewPPis, * vFanins;
    Gia_Obj_t * pObj, * pFanin;
    int i, k, RetValue, Counters[3] = {0};

    // (0) make sure fanin counters are 0 at the beginning
//    Gia_ManForEachObj( p->pGia, pObj, i )
//        assert( Rnm_ObjCount(p, pObj) == 0 );

    // (1) increment PPI fanin counters
    Vec_IntClear( p->vFanins );
    Gia_ManForEachObjVec( vOldPPis, p->pGia, pObj, i )
    {
        vFanins = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vFanins, p->pGia, pFanin, k )
            if ( Rnm_ObjAddToCount(p, pFanin) == 0 ) // fanin counter is 0 -- save it
                Vec_IntPush( p->vFanins, Gia_ObjId(p->pGia, pFanin) );
    }

    // (3) select objects with reconvergence, which create potential constraints
    // - flop objects
    // - objects whose fanin belongs to the justified area
    // - objects whose fanins overlap
    // (these do not guantee reconvergence, but may potentially have it)
    // (other objects cannot have reconvergence, even if they are added)
    vNewPPis = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vOldPPis, p->pGia, pObj, i )
    {
        if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( fVerbose )
                Counters[0]++;
            Vec_IntPush( vNewPPis, Gia_ObjId(p->pGia, pObj) );
            continue;
        }
        vFanins = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vFanins, p->pGia, pFanin, k )
        {
            if ( Rnm_ObjIsJust(p, pFanin) || Rnm_ObjCount(p, pFanin) > 1 )
            {
                if ( fVerbose )
                    Counters[1] += Rnm_ObjIsJust(p, pFanin);
                if ( fVerbose )
                    Counters[2] += (Rnm_ObjCount(p, pFanin) > 1);
                Vec_IntPush( vNewPPis, Gia_ObjId(p->pGia, pObj) );
                break;
            }
        }
    }
    RetValue = Vec_IntUniqify( vNewPPis );
    assert( RetValue == 0 );

    // (4) clear fanin counters
    // this is important for counters to be correctly set in the future iterations -- see step (0)
    Gia_ManForEachObjVec( p->vFanins, p->pGia, pObj, i )
        Rnm_ObjSetCount( p, pObj, 0 );

    // visualize
    if ( fVerbose )
        printf( "*** Refinement %3d : PI+PPI =%4d. Old =%4d. New =%4d.   FF =%4d. Just =%4d. Shared =%4d.\n", 
            p->nRefId, Vec_IntSize(p->vMap), Vec_IntSize(vOldPPis), Vec_IntSize(vNewPPis), Counters[0], Counters[1], Counters[2] );

//    Rnm_ManPrintSelected( p, vNewPPis );
//    Ga2_StructAnalize( p->pGia, p->vMap, p->vObjs, vNewPPis );
    return vNewPPis;
}